

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreDataAlignmentTest::Cleanup
          (ImageLoadStoreDataAlignmentTest *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  if (this->m_program_id != 0) {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program_id);
    this->m_program_id = 0;
  }
  if (this->m_destination_texture_id != 0) {
    glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_destination_texture_id);
    this->m_destination_texture_id = 0;
  }
  if (this->m_source_texture_id != 0) {
    glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->m_source_texture_id);
    this->m_source_texture_id = 0;
  }
  if (this->m_vertex_array_object_id != 0) {
    glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array_object_id);
    this->m_vertex_array_object_id = 0;
  }
  if (this->m_vertex_buffer_id != 0) {
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vertex_buffer_id);
    this->m_vertex_buffer_id = 0;
  }
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		/* Reset OpenGL state */
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glBindTexture(GL_TEXTURE_2D, 0);
		glBindVertexArray(0);
		glUseProgram(0);

		/* Delete program */
		if (0 != m_program_id)
		{
			glDeleteProgram(m_program_id);
			m_program_id = 0;
		}

		/* Delete textures */
		if (0 != m_destination_texture_id)
		{
			glDeleteTextures(1, &m_destination_texture_id);
			m_destination_texture_id = 0;
		}

		if (0 != m_source_texture_id)
		{
			glDeleteTextures(1, &m_source_texture_id);
			m_source_texture_id = 0;
		}

		/* Delete vertex array object */
		if (0 != m_vertex_array_object_id)
		{
			glDeleteVertexArrays(1, &m_vertex_array_object_id);
			m_vertex_array_object_id = 0;
		}

		/* Delete buffer */
		if (0 != m_vertex_buffer_id)
		{
			glDeleteBuffers(1, &m_vertex_buffer_id);
			m_vertex_buffer_id = 0;
		}

		/* Done */
		return NO_ERROR;
	}